

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zePhysicalMemDestroyPrologue
          (ZEHandleLifetimeValidation *this,ze_context_handle_t hContext,
          ze_physical_mem_handle_t hPhysicalMemory)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  iterator iVar4;
  iterator iVar5;
  _Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  _Hashtable<_ze_physical_mem_handle_t_*,_std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_physical_mem_handle_t_*>,_std::hash<_ze_physical_mem_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  long lVar6;
  long *plVar7;
  key_type local_30;
  
  lVar1 = context;
  this_00 = (_Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(*(long *)(context + 0xd48) + 0x50);
  if (hContext == (ze_context_handle_t)0x0) {
    local_30 = (ze_context_handle_t)0x0;
LAB_0018ac00:
    iVar4 = std::
            _Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,&local_30);
    if (iVar4.
        super__Node_iterator_base<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
        ._M_cur != (__node_type *)0x0) goto LAB_0018ac0e;
LAB_0018acc3:
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    local_30 = hContext;
    iVar4 = std::
            _Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,&local_30);
    if (iVar4.
        super__Node_iterator_base<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      this_00 = &((*(HandleLifetimeValidation **)(lVar1 + 0xd48))->contextHandleStateMap)._M_h;
      local_30 = hContext;
      goto LAB_0018ac00;
    }
    bVar2 = HandleLifetimeValidation::hasDependents
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hContext);
    if (bVar2) {
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    lVar6 = *(long *)(lVar1 + 0xd48);
    plVar7 = *(long **)(lVar6 + 0xbf8);
    if (plVar7 != (long *)0x0) {
      local_30 = hContext;
      do {
        std::
        _Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase((_Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(plVar7 + 2),&local_30);
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
      lVar6 = *(long *)(lVar1 + 0xd48);
    }
    local_30 = hContext;
    std::
    _Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(lVar6 + 0x50));
LAB_0018ac0e:
    this_01 = (_Hashtable<_ze_physical_mem_handle_t_*,_std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_physical_mem_handle_t_*>,_std::hash<_ze_physical_mem_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(*(long *)(lVar1 + 0xd48) + 0x328);
    if (hPhysicalMemory == (ze_physical_mem_handle_t)0x0) {
      local_30 = (key_type)0x0;
LAB_0018acb5:
      iVar5 = std::
              _Hashtable<_ze_physical_mem_handle_t_*,_std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_physical_mem_handle_t_*>,_std::hash<_ze_physical_mem_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_01,(key_type *)&local_30);
      if (iVar5.
          super__Node_iterator_base<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_0018acc3;
    }
    else {
      local_30 = (key_type)hPhysicalMemory;
      iVar5 = std::
              _Hashtable<_ze_physical_mem_handle_t_*,_std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_physical_mem_handle_t_*>,_std::hash<_ze_physical_mem_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_01,(key_type *)&local_30);
      if (iVar5.
          super__Node_iterator_base<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        this_01 = &((*(HandleLifetimeValidation **)(lVar1 + 0xd48))->physicalMemHandleStateMap)._M_h
        ;
        local_30 = (key_type)hPhysicalMemory;
        goto LAB_0018acb5;
      }
      bVar2 = HandleLifetimeValidation::hasDependents
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hPhysicalMemory);
      if (bVar2) {
        return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
      }
      lVar6 = *(long *)(lVar1 + 0xd48);
      plVar7 = *(long **)(lVar6 + 0xbf8);
      if (plVar7 != (long *)0x0) {
        local_30 = (key_type)hPhysicalMemory;
        do {
          std::
          _Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase((_Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(plVar7 + 2),&local_30);
          plVar7 = (long *)*plVar7;
        } while (plVar7 != (long *)0x0);
        lVar6 = *(long *)(lVar1 + 0xd48);
      }
      local_30 = (key_type)hPhysicalMemory;
      std::
      _Hashtable<_ze_physical_mem_handle_t_*,_std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_physical_mem_handle_t_*>,_std::hash<_ze_physical_mem_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<_ze_physical_mem_handle_t_*,_std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_physical_mem_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_physical_mem_handle_t_*>,_std::hash<_ze_physical_mem_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(lVar6 + 0x328));
    }
    zVar3 = ZE_RESULT_SUCCESS;
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zePhysicalMemDestroyPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_physical_mem_handle_t hPhysicalMemory        ///< [in][release] handle of physical memory object to destroy
        )
    { 
        
        if (hContext && context.handleLifetime->isHandleValid( hContext )){
            if (context.handleLifetime->hasDependents( hContext )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hContext);
            context.handleLifetime->removeHandle( hContext );
        } else if (!context.handleLifetime->isHandleValid( hContext )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (hPhysicalMemory && context.handleLifetime->isHandleValid( hPhysicalMemory )){
            if (context.handleLifetime->hasDependents( hPhysicalMemory )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hPhysicalMemory);
            context.handleLifetime->removeHandle( hPhysicalMemory );
        } else if (!context.handleLifetime->isHandleValid( hPhysicalMemory )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }